

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.h
# Opt level: O2

void __thiscall r_exec::Goal::~Goal(Goal *this)

{
  (this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
  super__Object._vptr__Object = (_func_int **)&PTR__Goal_001d0f08;
  core::P<r_exec::_Fact>::~P(&this->ground);
  core::P<r_exec::Sim>::~P(&this->sim);
  Object<r_code::LObject,_r_exec::LObject>::~Object
            ((Object<r_code::LObject,_r_exec::LObject> *)this);
  return;
}

Assistant:

class REPLICODE_EXPORT Goal:
    public LObject
{
public:
    Goal();
    Goal(r_code::SysObject *source);
    Goal(_Fact *target, Code *actor, double psln_thr);

    bool invalidate();
    bool is_invalidated();
    bool ground_invalidated(_Fact *evidence);

    bool is_requirement() const;

    bool is_self_goal() const;
    bool is_drive() const;

    _Fact *get_target() const;
    _Fact *get_super_goal() const;
    Code *get_actor() const;

    P<Sim> sim;
    P<_Fact> ground; // f->p->f->imdl (weak requirement) that allowed backward chaining, if any.

    double get_strength(uint64_t now) const; // goal->target->cfd/(before-now).
}